

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddWatchOnlyWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CScript *dest)

{
  long lVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  key_type *in_RDX;
  map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
  *in_RSI;
  LegacyScriptPubKeyMan *in_RDI;
  long in_FS_OFFSET;
  CKeyMetadata *meta;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
  *nCreateTime;
  CScriptID *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CScript *in_stack_ffffffffffffffe8;
  LegacyDataSPKM *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = LegacyDataSPKM::AddWatchOnlyInMem(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if (bVar3) {
    nCreateTime = &(in_RDI->super_LegacyDataSPKM).m_script_metadata;
    CScriptID::CScriptID(in_stack_ffffffffffffffc0,(CScript *)in_RDI);
    std::
    map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
    ::operator[](in_RSI,in_RDX);
    UpdateTimeFirstKey(in_RDI,(int64_t)nCreateTime);
    boost::signals2::
    signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
    ::operator()((signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
                  *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),false);
    bVar3 = WalletBatch::WriteWatchOnly
                      ((WalletBatch *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                       (CKeyMetadata *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                      );
    if (bVar3) {
      pWVar2 = (in_RDI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar2->_vptr_WalletStorage[5])(pWVar2,in_RSI);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddWatchOnlyWithDB(WalletBatch &batch, const CScript& dest)
{
    if (!AddWatchOnlyInMem(dest))
        return false;
    const CKeyMetadata& meta = m_script_metadata[CScriptID(dest)];
    UpdateTimeFirstKey(meta.nCreateTime);
    NotifyWatchonlyChanged(true);
    if (batch.WriteWatchOnly(dest, meta)) {
        m_storage.UnsetBlankWalletFlag(batch);
        return true;
    }
    return false;
}